

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O0

void fdsocket_select_result_input_error(int fd,int event)

{
  ssize_t sVar1;
  undefined1 local_5018 [4];
  int retd;
  char buf [20480];
  FdSocket *fds;
  int event_local;
  int fd_local;
  
  fds._0_4_ = event;
  fds._4_4_ = fd;
  buf._20472_8_ = find234(fdsocket_by_inerrfd,(void *)((long)&fds + 4),fdsocket_inerrfd_find);
  if ((void *)buf._20472_8_ != (void *)0x0) {
    sVar1 = read(fds._4_4_,local_5018,0x5000);
    if ((int)sVar1 < 1) {
      del234(fdsocket_by_inerrfd,(void *)buf._20472_8_);
      uxsel_del(*(int *)(buf._20472_8_ + 8));
      close(*(int *)(buf._20472_8_ + 8));
      *(undefined4 *)(buf._20472_8_ + 8) = 0xffffffff;
    }
    else {
      log_proxy_stderr(*(Plug **)(buf._20472_8_ + 0x2088),(ProxyStderrBuf *)(buf._20472_8_ + 0x68),
                       local_5018,(long)(int)sVar1);
    }
  }
  return;
}

Assistant:

static void fdsocket_select_result_input_error(int fd, int event)
{
    FdSocket *fds;
    char buf[20480];
    int retd;

    if (!(fds = find234(fdsocket_by_inerrfd, &fd, fdsocket_inerrfd_find)))
        return;

    retd = read(fd, buf, sizeof(buf));
    if (retd > 0) {
        log_proxy_stderr(fds->plug, &fds->psb, buf, retd);
    } else {
        del234(fdsocket_by_inerrfd, fds);
        uxsel_del(fds->inerrfd);
        close(fds->inerrfd);
        fds->inerrfd = -1;
    }
}